

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>::push_back
          (SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false> *this,NameIndex *Elt)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  DWARFDebugNames *pDVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint uVar13;
  long lVar14;
  
  uVar13 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
           super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
      super_SmallVectorBase.Capacity <= uVar13) {
    grow(this,0);
    uVar13 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
             super_SmallVectorBase.Size;
  }
  pvVar2 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
           super_SmallVectorBase.BeginX;
  lVar14 = (ulong)uVar13 * 0x98;
  puVar1 = (undefined8 *)((long)pvVar2 + lVar14);
  *(undefined4 *)(puVar1 + 2) = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  *puVar1 = (Elt->Abbrevs).
            super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
            .TheMap.Buckets;
  (Elt->Abbrevs).
  super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
  .TheMap.Buckets = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0;
  *(uint *)(puVar1 + 1) =
       (Elt->Abbrevs).
       super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
       .TheMap.NumEntries;
  (Elt->Abbrevs).
  super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
  .TheMap.NumEntries = 0;
  uVar13 = *(uint *)((long)puVar1 + 0xc);
  *(uint *)((long)puVar1 + 0xc) =
       (Elt->Abbrevs).
       super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
       .TheMap.NumTombstones;
  (Elt->Abbrevs).
  super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
  .TheMap.NumTombstones = uVar13;
  uVar13 = *(uint *)(puVar1 + 2);
  *(uint *)(puVar1 + 2) =
       (Elt->Abbrevs).
       super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
       .TheMap.NumBuckets;
  (Elt->Abbrevs).
  super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
  .TheMap.NumBuckets = uVar13;
  *(uint32_t *)(puVar1 + 7) = (Elt->Hdr).super_HeaderPOD.AugmentationStringSize;
  uVar3 = *(undefined8 *)&(Elt->Hdr).super_HeaderPOD;
  uVar4 = *(undefined8 *)&(Elt->Hdr).super_HeaderPOD.CompUnitCount;
  uVar5 = *(undefined8 *)&(Elt->Hdr).super_HeaderPOD.NameCount;
  puVar1[5] = *(undefined8 *)&(Elt->Hdr).super_HeaderPOD.ForeignTypeUnitCount;
  puVar1[6] = uVar5;
  puVar1[3] = uVar3;
  puVar1[4] = uVar4;
  SmallVector<char,_8U>::SmallVector
            ((SmallVector<char,_8U> *)(puVar1 + 8),
             &(Elt->Hdr).AugmentationString.super_SmallVector<char,_8U>);
  pDVar6 = Elt->Section;
  uVar7 = Elt->Base;
  uVar8 = Elt->CUsBase;
  uVar9 = Elt->BucketsBase;
  uVar10 = Elt->HashesBase;
  uVar11 = Elt->StringOffsetsBase;
  uVar12 = Elt->EntriesBase;
  *(uint64_t *)((long)pvVar2 + lVar14 + 0x88) = Elt->EntryOffsetsBase;
  *(uint64_t *)((long)pvVar2 + lVar14 + 0x90) = uVar12;
  *(uint64_t *)((long)pvVar2 + lVar14 + 0x78) = uVar10;
  *(uint64_t *)((long)pvVar2 + lVar14 + 0x80) = uVar11;
  *(uint64_t *)((long)pvVar2 + lVar14 + 0x68) = uVar8;
  *(uint64_t *)((long)pvVar2 + lVar14 + 0x70) = uVar9;
  *(DWARFDebugNames **)((long)pvVar2 + lVar14 + 0x58) = pDVar6;
  *(uint64_t *)((long)pvVar2 + lVar14 + 0x60) = uVar7;
  uVar13 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
           super_SmallVectorBase.Size;
  if (uVar13 < (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
               super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
    super_SmallVectorBase.Size = uVar13 + 1;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }